

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

bool DivisionCornerCaseHelper<long,_unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter,_1>
     ::DivisionCornerCase1
               (uchar lhs,SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs,
               SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter> *result)

{
  bool bVar1;
  long lVar2;
  SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter> *this;
  SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter> *in_RDX;
  long in_RSI;
  byte in_DIL;
  SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter> *in_stack_ffffffffffffffb0;
  long local_48;
  SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter> local_40;
  long local_38;
  long local_30;
  SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter> local_28;
  SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter> *local_20;
  byte local_11;
  SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter> local_10;
  
  local_20 = in_RDX;
  local_11 = in_DIL;
  local_10.m_int = in_RSI;
  lVar2 = ::SafeInt::operator_cast_to_long(in_stack_ffffffffffffffb0);
  if (lVar2 < 1) {
    lVar2 = ::SafeInt::operator_cast_to_long(in_stack_ffffffffffffffb0);
    if (lVar2 == 0) {
      safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnDivZero();
    }
    local_38 = local_10.m_int;
    bVar1 = DivisionNegativeCornerCaseHelper<long,_unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter,_0>
            ::NegativeCornerCase(local_11,local_10,local_20);
    if (!bVar1) {
      local_48 = ::SafeInt::operator_cast_to_long(in_stack_ffffffffffffffb0);
      local_48 = (long)(ulong)local_11 / local_48;
      SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt
                (&local_40,&local_48);
      local_20->m_int = local_40.m_int;
    }
  }
  else {
    this = (SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)(ulong)local_11;
    local_30 = ::SafeInt::operator_cast_to_long(this);
    local_30 = (long)this / local_30;
    SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt
              (&local_28,&local_30);
    local_20->m_int = local_28.m_int;
  }
  return true;
}

Assistant:

static bool DivisionCornerCase1( U lhs, SafeInt< T, E > rhs, SafeInt<T, E>& result ) SAFEINT_CPP_THROW
    {
        if( (T)rhs > 0 )
        {
            result = SafeInt< T, E >( lhs/(T)rhs );
            return true;
        }

        // Now rhs is either negative, or zero
        if( (T)rhs != 0 )
        {
            if( DivisionNegativeCornerCaseHelper< T, U, E, sizeof( U ) >= 4 && sizeof( T ) <= sizeof( U ) >::NegativeCornerCase( lhs, rhs, result ) )
                return true;

            result = SafeInt< T, E >(lhs/(T)rhs);
            return true;
        }

        E::SafeIntOnDivZero();
    }